

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectiveAlign::Encode(CDirectiveAlign *this)

{
  bool bVar1;
  int iVar2;
  u64 uVar3;
  size_t in_RCX;
  int iVar4;
  uchar AlignBuffer [128];
  undefined1 auStack_98 [128];
  
  uVar3 = FileManager::getVirtualAddress(g_fileManager);
  iVar2 = (int)(uVar3 % (ulong)(long)this->alignment);
  iVar4 = this->alignment - iVar2;
  if (iVar2 == 0) {
    iVar4 = 0;
  }
  iVar2 = 0x80;
  if (iVar4 < 0x80) {
    iVar2 = iVar4;
  }
  memset(auStack_98,0,(long)iVar2);
  iVar2 = iVar4;
  if (0x80 < iVar4) {
    do {
      FileManager::write(g_fileManager,(int)auStack_98,(void *)0x80,in_RCX);
      iVar2 = iVar4 + -0x80;
      bVar1 = 0x100 < iVar4;
      iVar4 = iVar2;
    } while (bVar1);
  }
  FileManager::write(g_fileManager,(int)auStack_98,(void *)(long)iVar2,in_RCX);
  return;
}

Assistant:

void CDirectiveAlign::Encode()
{
	unsigned char AlignBuffer[128];
	
	int n = computePadding();
	memset(AlignBuffer,0,n > 128 ? 128 : n);
	while (n > 128)
	{
		g_fileManager->write(AlignBuffer,128);
		n -= 128;
	}
	g_fileManager->write(AlignBuffer,n);
}